

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseSos
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  pointer *pppVar1;
  iterator __position;
  pointer pbVar2;
  pointer pvVar3;
  iterator __position_00;
  double dVar4;
  size_t sVar5;
  bool bVar6;
  short sVar7;
  Parsekey PVar8;
  int iVar9;
  long lVar10;
  HighsInt id;
  size_t *end_00;
  HMpsFF *pHVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool skip;
  bool is_nan;
  size_t end;
  string colname;
  string word_1;
  string strline;
  string word;
  size_t begin;
  Parsekey local_118;
  bool local_111;
  HighsLogOptions *local_110;
  undefined1 local_108 [40];
  size_t local_e0;
  string local_d8;
  HighsInt local_b8;
  Parsekey local_b4;
  undefined1 local_b0 [32];
  vector<short,_std::allocator<short>_> *local_90;
  vector<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::allocator<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
  *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  local_88 = (vector<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::allocator<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
              *)&this->sos_entries;
  local_90 = &this->sos_type;
  local_80 = &this->sos_name;
  pHVar11 = this;
  local_110 = log_options;
  local_b4 = keyword;
  while( true ) {
    do {
      bVar6 = getMpsLine(pHVar11,file,&local_78,&local_111);
      if (!bVar6) {
        local_118 = kFail;
        goto LAB_001f90a8;
      }
    } while (local_111 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar10 = std::chrono::_V2::system_clock::now(),
       dVar4 = (double)lVar10 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar4 && dVar4 != this->time_limit_)) break;
    local_b0._0_8_ = local_b0 + 0x10;
    local_b0._8_8_ = 0;
    local_b0[0x10] = '\0';
    end_00 = &local_e0;
    PVar8 = checkFirstWord(this,&local_78,&local_38,end_00,(string *)local_b0);
    id = (HighsInt)end_00;
    if (PVar8 == kNone) {
      iVar9 = std::__cxx11::string::compare((char *)local_b0);
      if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)local_b0), iVar9 == 0)) {
        first_word(&local_d8,&local_78,local_e0);
        if (local_d8._M_string_length == 0) {
          highsLogUser(local_110,kError,"No name given for SOS\n");
          goto LAB_001f8f74;
        }
        sVar7 = (*(char *)(local_b0._0_8_ + 1) != '1') + 1;
        local_108._0_2_ = sVar7;
        __position._M_current =
             (this->sos_type).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->sos_type).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (local_90,__position,(short *)local_108);
        }
        else {
          *__position._M_current = sVar7;
          (this->sos_type).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_80,&local_d8);
        local_108._0_8_ = (HMpsFF *)0x0;
        local_108._8_8_ = (pointer)0x0;
        local_108._16_8_ = 0;
        std::
        vector<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::allocator<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
        ::emplace_back<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
                  (local_88,(vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)local_108);
        if ((HMpsFF *)local_108._0_8_ != (HMpsFF *)0x0) {
          operator_delete((void *)local_108._0_8_);
        }
        bVar6 = false;
      }
      else {
        if ((this->sos_entries).
            super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->sos_entries).
            super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          trim(&local_78,&default_non_chars_abi_cxx11_);
          highsLogUser(local_110,kError,"SOS type specification missing before %s.\n",
                       local_78._M_dataplus._M_p);
          local_118 = kFail;
          bVar6 = true;
          goto LAB_001f8fd7;
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        if (local_b4 == kSos) {
          std::__cxx11::string::_M_assign((string *)&local_d8);
LAB_001f8d29:
          local_b8 = getColIdx(this,&local_d8,true);
          sVar5 = local_e0;
          bVar6 = is_end(&local_78,local_e0,&default_non_chars_abi_cxx11_);
          uVar12 = 0;
          uVar13 = 0;
          if (!bVar6) {
            first_word((string *)local_108,&local_78,sVar5);
            std::__cxx11::string::operator=((string *)local_b0,(string *)local_108);
            pHVar11 = (HMpsFF *)local_108._0_8_;
            if ((HMpsFF *)local_108._0_8_ != (HMpsFF *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_);
            }
            local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
            dVar4 = getValue(pHVar11,(string *)local_b0,(bool *)local_108,id);
            uVar12 = SUB84(dVar4,0);
            uVar13 = (undefined4)((ulong)dVar4 >> 0x20);
            if (local_108[0] == (string)0x1) {
              highsLogUser(local_110,kError,"Weight for column \"%s\" is NaN\n",
                           local_d8._M_dataplus._M_p);
              goto LAB_001f8f74;
            }
          }
          pvVar3 = (this->sos_entries).
                   super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_108._0_4_ = local_b8;
          local_108._8_8_ = CONCAT44(uVar13,uVar12);
          __position_00._M_current =
               pvVar3[-1].
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              pvVar3[-1].
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>>
                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                       (pvVar3 + -1),__position_00,(pair<int,_double> *)local_108);
          }
          else {
            *(undefined8 *)__position_00._M_current = local_108._0_8_;
            (__position_00._M_current)->second = (double)local_108._8_8_;
            pppVar1 = &pvVar3[-1].
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          bVar6 = false;
        }
        else {
          pbVar2 = (this->sos_name).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((local_b0._8_8_ == pbVar2[-1]._M_string_length) &&
             ((local_b0._8_8_ == 0 ||
              (iVar9 = bcmp((void *)local_b0._0_8_,pbVar2[-1]._M_dataplus._M_p,local_b0._8_8_),
              iVar9 == 0)))) {
            sVar5 = local_e0;
            bVar6 = is_end(&local_78,local_e0,&default_non_chars_abi_cxx11_);
            if (!bVar6) {
              first_word((string *)local_108,&local_78,sVar5);
              std::__cxx11::string::operator=((string *)&local_d8,(string *)local_108);
              if ((HMpsFF *)local_108._0_8_ != (HMpsFF *)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_);
              }
              local_e0 = first_word_end(&local_78,sVar5);
              goto LAB_001f8d29;
            }
            trim(&local_78,&default_non_chars_abi_cxx11_);
            highsLogUser(local_110,kError,"Missing variable in SOS specification line %s.\n",
                         local_78._M_dataplus._M_p);
          }
          else {
            trim((string *)local_b0,&default_non_chars_abi_cxx11_);
            highsLogUser(local_110,kError,
                         "SOS specification for SOS %s mixed with SOS %s. This is currently not supported.\n"
                         ,(this->sos_name).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,
                         local_b0._0_8_);
          }
LAB_001f8f74:
          local_118 = kFail;
          bVar6 = true;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    else {
      bVar6 = true;
      highsLogDev(local_110,kInfo,"readMPS: Read SETS    OK\n");
      local_118 = PVar8;
    }
LAB_001f8fd7:
    pHVar11 = (HMpsFF *)local_b0._0_8_;
    if ((HMpsFF *)local_b0._0_8_ != (HMpsFF *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_);
    }
    if (bVar6) {
LAB_001f90a8:
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      return local_118;
    }
  }
  local_118 = kTimeout;
  goto LAB_001f90a8;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseSos(const HighsLogOptions& log_options,
                                           std::istream& file,
                                           const HMpsFF::Parsekey keyword) {
  std::string strline, word;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read SETS    OK\n");
      return key;
    }

    if (word == "S1" || word == "S2") {
      /* a new SOS is starting */
      std::string sosname = first_word(strline, end);

      if (sosname.empty()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "No name given for SOS\n");
        return HMpsFF::Parsekey::kFail;
      }

      sos_type.push_back(word[1] == '1' ? 1 : 2);
      sos_name.push_back(sosname);
      sos_entries.push_back(std::vector<std::pair<HighsInt, double> >());
      continue;
    }

    /* a SOS is continuing
     * word is currently the column name and there may be a weight following
     */
    if (sos_entries.empty()) {
      trim(strline);
      highsLogUser(log_options, HighsLogType::kError,
                   "SOS type specification missing before %s.\n",
                   strline.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string colname;

    if (keyword == HMpsFF::Parsekey::kSos) {
      // first word is column index
      colname = word;
    } else {
      // first word is SOS name, second word is colname, third word is weight
      // we expect SOS definitions to be contiguous for now
      if (word != sos_name.back()) {
        trim(word);
        highsLogUser(log_options, HighsLogType::kError,
                     "SOS specification for SOS %s mixed with SOS %s. This is "
                     "currently not supported.\n",
                     sos_name.back().c_str(), word.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (is_end(strline, end)) {
        trim(strline);
        highsLogUser(log_options, HighsLogType::kError,
                     "Missing variable in SOS specification line %s.\n",
                     strline.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      colname = first_word(strline, end);
      end = first_word_end(strline, end);
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    // last word is weight, allow to omit
    double weight = 0.0;
    if (!is_end(strline, end)) {
      word = first_word(strline, end);
      bool is_nan = false;
      weight = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Weight for column \"%s\" is NaN\n", colname.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }

    sos_entries.back().push_back(std::make_pair(colidx, weight));
  }

  return HMpsFF::Parsekey::kFail;
}